

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_disconnect(Curl_easy *data,connectdata *conn,_Bool dead_connection)

{
  anon_union_280_8_fcbf97e8_for_proto *pp;
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  undefined7 in_register_00000011;
  smtp_conn *smtpc;
  
  pp = &conn->proto;
  if (((((int)CONCAT71(in_register_00000011,dead_connection) == 0) &&
       (((conn->bits).field_0x1 & 0x20) != 0)) &&
      (CVar2 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","QUIT"), CVar2 == CURLE_OK)) &&
     (smtp_state(data,SMTP_QUIT), (conn->proto).smtpc.state != SMTP_STOP)) {
    do {
      CVar2 = Curl_pp_statemach(data,&(pp->ftpc).pp,true,true);
      if ((conn->proto).smtpc.state == SMTP_STOP) break;
    } while (CVar2 == CURLE_OK);
  }
  Curl_pp_disconnect(&(pp->ftpc).pp);
  Curl_sasl_cleanup(conn,*(unsigned_short *)((long)&conn->proto + 0xbc));
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (conn->proto).ftpc.newhost = (char *)0x0;
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
      ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) &&
     (0 < Curl_trc_feat_smtp.log_level)) {
    Curl_trc_smtp(data,"smtp_disconnect(), finished");
  }
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_disconnect(struct Curl_easy *data,
                                struct connectdata *conn,
                                bool dead_connection)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  (void)data;

  /* We cannot send quit unconditionally. If this connection is stale or
     bad in any way, sending quit and waiting around here will make the
     disconnect wait in vain and cause more problems than we need to. */

  if(!dead_connection && conn->bits.protoconnstart) {
    if(!smtp_perform_quit(data, conn))
      (void)smtp_block_statemach(data, conn, TRUE); /* ignore errors on QUIT */
  }

  /* Disconnect from the server */
  Curl_pp_disconnect(&smtpc->pp);

  /* Cleanup the SASL module */
  Curl_sasl_cleanup(conn, smtpc->sasl.authused);

  /* Cleanup our connection based variables */
  Curl_safefree(smtpc->domain);
  CURL_TRC_SMTP(data, "smtp_disconnect(), finished");

  return CURLE_OK;
}